

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

ssize_t __thiscall
LinkedReadsDatastore::read(LinkedReadsDatastore *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  void *__buf_00;
  undefined4 in_register_00000034;
  string *in_stack_00000168;
  LinkedReadsDatastore *in_stack_00000170;
  string *in_stack_ffffffffffffffb8;
  ifstream *in_stack_ffffffffffffffc0;
  string local_30 [32];
  undefined8 local_10;
  LinkedReadsDatastore *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  sdglib::read_string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sdglib::read_string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::string(local_30,(string *)this);
  load_index(in_stack_00000170,in_stack_00000168);
  std::__cxx11::string::~string(local_30);
  sVar1 = LinkedReadsMapper::read(&this->mapper,(int)local_10,__buf_00,__nbytes);
  return sVar1;
}

Assistant:

void LinkedReadsDatastore::read(std::ifstream &input_file) {
    //read filename
    sdglib::read_string(input_file, filename);
    sdglib::read_string(input_file, name);

    load_index(filename);
    mapper.read(input_file);
}